

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

void notch::core::internal::gemv<float*,float_const*,float*>
               (float *m_begin,float *m_end,float *x_begin,float *x_end,float *b_begin,float *b_end)

{
  ostream *poVar1;
  invalid_argument *this;
  long lVar2;
  long lVar3;
  float fVar4;
  ostringstream what;
  string local_1c0 [32];
  ostringstream local_1a0 [376];
  
  lVar2 = (long)x_end - (long)x_begin >> 2;
  if ((long)m_end - (long)m_begin >> 2 != ((long)b_end - (long)b_begin >> 2) * lVar2) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"stl_gemv: incompatible matrix and vector shapes:\n",0x31);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," matrix size = ",0xf)
    ;
    poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1," vector size = ",0xf);
    poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1," result size = ",0xf);
    ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::stringbuf::str();
    ::std::invalid_argument::invalid_argument(this,local_1c0);
    __cxa_throw(this,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument);
  }
  if (b_begin != b_end) {
    do {
      fVar4 = *b_begin;
      if (x_end != x_begin) {
        lVar3 = 0;
        do {
          fVar4 = fVar4 + *(float *)((long)m_begin + lVar3) * *(float *)((long)x_begin + lVar3);
          lVar3 = lVar3 + 4;
        } while ((long)x_end - (long)x_begin != lVar3);
      }
      *b_begin = fVar4;
      b_begin = b_begin + 1;
      m_begin = m_begin + lVar2;
    } while (b_begin != b_end);
  }
  return;
}

Assistant:

void
INTERNAL_NOBLAS(gemv)(
     Matrix_Iter m_begin, Matrix_Iter m_end,
     VectorX_Iter x_begin, VectorX_Iter x_end,
     VectorB_Iter b_begin, VectorB_Iter b_end) {
    size_t cols = std::distance(x_begin, x_end);
    size_t rows = std::distance(b_begin, b_end);
    size_t n = std::distance(m_begin, m_end);
    if (n != rows * cols) {
        std::ostringstream what;
        what << "stl_gemv: incompatible matrix and vector shapes:\n"
            << " matrix size = " << n
            << " vector size = " << cols
            << " result size = " << rows;
        throw std::invalid_argument(what.str());
    }
    size_t r = 0; // current row number
    for (auto b = b_begin; b != b_end; ++b, ++r) {
        auto row_begin = m_begin + r * cols;
        auto row_end = row_begin + cols;
        *b = std::inner_product(row_begin, row_end, x_begin, *b);
    }
}